

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O1

void __thiscall ON_SubDHeap::ReturnFace(ON_SubDHeap *this,ON_SubDFace *f)

{
  if (f != (ON_SubDFace *)0x0) {
    if (f->m_texture_points != (ON_3dPoint *)0x0) {
      Return3dPointArray(this,f->m_texture_points);
      f->m_texture_points = (ON_3dPoint *)0x0;
      f->m_texture_status_bits = '\0';
    }
    ReturnArray(this,(ulong)f->m_edgex_capacity,&f->m_edgex->m_ptr);
    (f->super_ON_SubDComponentBase).m_archive_id = 0xffffffff;
    (f->super_ON_SubDComponentBase).m_status = ON_ComponentStatus::Deleted;
    f->m_next_face = this->m_unused_face;
    this->m_unused_face = f;
  }
  return;
}

Assistant:

void ON_SubDHeap::ReturnFace(class ON_SubDFace* f)
{
  if (nullptr != f)
  {
    if (f->m_texture_points)
    {
      this->Return3dPointArray(f->m_texture_points);
      f->m_texture_points = nullptr;
      f->m_texture_status_bits = 0;
    }
    ReturnArray(f->m_edgex_capacity,(ON__UINT_PTR*)f->m_edgex);
    (&f->m_id)[1] = ON_UNSET_UINT_INDEX; // m_archive_id == ON_UNSET_UINT_INDEX marks the fixed size pool element as unused
    f->m_status = ON_ComponentStatus::Deleted;
    f->m_next_face = m_unused_face;
    m_unused_face = f;
    // It is critical that f->m_symmetry_set_next remains set
    // so deleted elements of symmetric SubDs can be found.

    // NO! // m_fspf.ReturnElement(f);
    // See comments in AllocateVertexAndSetId();
  }
}